

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnMemory
          (BinaryReaderIR *this,Index index,Limits *page_limits)

{
  char *__s;
  Offset OVar1;
  uint64_t uVar2;
  size_t sVar3;
  __uniq_ptr_impl<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> local_30;
  
  __s = this->filename_;
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  sVar3 = strlen(__s);
  local_30._M_t.
  super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>.
  super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl =
       (tuple<wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>)
       operator_new(0x78);
  *(long *)((long)local_30._M_t.
                  super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
                  .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)local_30._M_t.
                  super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
                  .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x10) = 0;
  *(size_t *)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
          .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x18) = sVar3;
  *(char **)((long)local_30._M_t.
                   super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
                   .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x20) =
       __s;
  *(Offset *)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
          .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x28) = OVar1;
  *(undefined4 *)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
          .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined4 *)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
          .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x38) = 7;
  *(undefined ***)
   local_30._M_t.
   super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>.
   super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl =
       &PTR__MemoryModuleField_0017a370;
  *(long **)((long)local_30._M_t.
                   super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
                   .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x40) =
       (long *)((long)local_30._M_t.
                      super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
                      .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x50);
  *(long *)((long)local_30._M_t.
                  super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
                  .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x48) = 0;
  *(undefined1 *)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
          .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x50) = 0;
  uVar2 = page_limits->max;
  *(uint64_t *)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
          .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x60) =
       page_limits->initial;
  *(uint64_t *)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
          .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x68) = uVar2;
  *(undefined4 *)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
          .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x6f) =
       *(undefined4 *)((long)&page_limits->max + 7);
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                       *)&local_30);
  if ((_Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>)
      local_30._M_t.
      super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
      .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl !=
      (MemoryModuleField *)0x0) {
    (**(code **)(*(long *)local_30._M_t.
                          super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
                          .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 8)
    )();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnMemory(Index index, const Limits* page_limits) {
  auto field = std::make_unique<MemoryModuleField>(GetLocation());
  Memory& memory = field->memory;
  memory.page_limits = *page_limits;
  module_->AppendField(std::move(field));
  return Result::Ok;
}